

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

xmlChar * htmlParseHTMLName(htmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  uint uVar3;
  int len;
  long lVar4;
  xmlChar loc [100];
  
  bVar1 = *ctxt->input->cur;
  if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
    uVar3 = bVar1 - 0x2e;
    if (0x31 < uVar3) {
      return (xmlChar *)0x0;
    }
    if ((0x2000000001001U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      return (xmlChar *)0x0;
    }
  }
  lVar4 = 0;
  len = 100;
  do {
    if (lVar4 == 100) {
LAB_0014e6cd:
      pxVar2 = xmlDictLookup(ctxt->dict,loc,len);
      return pxVar2;
    }
    bVar1 = *ctxt->input->cur;
    if ((byte)(bVar1 + 0xbf) < 0x1a) {
      bVar1 = bVar1 | 0x20;
    }
    else if ((9 < (byte)(bVar1 - 0x30) && 0x19 < (byte)(bVar1 + 0x9f)) &&
            ((0x32 < bVar1 - 0x2d || ((0x4000000002003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0)
             ))) {
      len = (int)lVar4;
      goto LAB_0014e6cd;
    }
    loc[lVar4] = bVar1;
    lVar4 = lVar4 + 1;
    xmlNextChar(ctxt);
  } while( true );
}

Assistant:

static const xmlChar *
htmlParseHTMLName(htmlParserCtxtPtr ctxt) {
    int i = 0;
    xmlChar loc[HTML_PARSER_BUFFER_SIZE];

    if (!IS_ASCII_LETTER(CUR) && (CUR != '_') &&
        (CUR != ':') && (CUR != '.')) return(NULL);

    while ((i < HTML_PARSER_BUFFER_SIZE) &&
           ((IS_ASCII_LETTER(CUR)) || (IS_ASCII_DIGIT(CUR)) ||
	   (CUR == ':') || (CUR == '-') || (CUR == '_') ||
           (CUR == '.'))) {
	if ((CUR >= 'A') && (CUR <= 'Z')) loc[i] = CUR + 0x20;
        else loc[i] = CUR;
	i++;

	NEXT;
    }

    return(xmlDictLookup(ctxt->dict, loc, i));
}